

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

Am_Object gen_match_command_for(Am_Object *sel_cmd,Am_Value_List *menu_commands)

{
  Am_Slot_Key key;
  Am_Wrapper *pAVar1;
  Am_Object *pAVar2;
  Am_Value_List *in_RDX;
  Am_Object AStack_28;
  
  Am_Object::Create(&AStack_28,(char *)&Am_Before_After_Match_Command);
  key = Am_COMMANDS_PROTOTYPES;
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(in_RDX);
  pAVar2 = Am_Object::Set(&AStack_28,key,pAVar1,0);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)menu_commands);
  pAVar2 = Am_Object::Set(pAVar2,0xc5,pAVar1,0);
  Am_Object::Am_Object(sel_cmd,pAVar2);
  Am_Object::~Am_Object(&AStack_28);
  return (Am_Object)(Am_Object_Data *)sel_cmd;
}

Assistant:

Am_Object
gen_match_command_for(Am_Object &sel_cmd, Am_Value_List &menu_commands)
{
  Am_Object match_command = Am_Before_After_Match_Command.Create()
                                .Set(Am_COMMANDS_PROTOTYPES, menu_commands)
                                .Set(Am_COMMAND, sel_cmd);
  return match_command;
}